

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O3

void dumpPointerGraph(DGLLVMPointerAnalysis *pta,PTType type)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  PointerGraph *pPVar3;
  _Base_ptr p_Var4;
  undefined8 *puVar5;
  PSNode *node_00;
  pointer ppPVar6;
  pointer puVar7;
  PSNode *pPVar8;
  bool bVar9;
  ulong uVar10;
  long *plVar11;
  long *plVar12;
  DGLLVMPointerAnalysis *pDVar13;
  long *plVar14;
  long lVar15;
  _Rb_tree_node_base *p_Var16;
  raw_ostream *this;
  _Rb_tree_node_base *p_Var17;
  undefined8 *puVar18;
  long lVar19;
  byte bVar20;
  long lVar21;
  pointer ppFVar22;
  char *pcVar23;
  ulong uVar24;
  _Base_ptr p_Var25;
  PSNode **node;
  pointer ppPVar26;
  pointer puVar27;
  undefined1 auVar28 [16];
  set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_> nodes;
  PSNode *nd;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> func_nodes;
  iterator __end2;
  undefined1 local_98 [8];
  const_iterator local_90;
  _Link_type p_Stack_88;
  _Rb_tree_node_base *local_80;
  _Rb_tree_node_base *local_78;
  size_t local_70;
  DGLLVMPointerAnalysis *local_68;
  PSNode *local_60;
  long *local_58;
  long *local_50;
  long local_48;
  pointer local_40;
  PSNode *local_38;
  
  lVar15 = dg::Offset::UNKNOWN;
  if (todot[0x80] != '\x01') {
    puVar27 = (pta->PS->nodes).
              super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (pta->PS->nodes).
             super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar27 == puVar7) {
      return;
    }
    do {
      pPVar8 = (puVar27->_M_t).
               super___uniq_ptr_impl<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>._M_t.
               super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>.
               super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl;
      if (pPVar8 != (PSNode *)0x0) {
        printf("NODE %3u: ");
        printName(pPVar8,false);
        if ((*(int *)(pPVar8 + 0x90) == 1) &&
           (((*(long *)(pPVar8 + 0x88) != 0 || (((byte)pPVar8[0xe9] & 1) != 0)) ||
            (pPVar8[0xe8] == (PSNode)0x1)))) {
          printf(" [size: %zu, heap: %u, zeroed: %u]");
        }
        for (puVar18 = *(undefined8 **)(pPVar8 + 0xc0); puVar18 != (undefined8 *)0x0;
            puVar18 = (undefined8 *)*puVar18) {
          uVar24 = puVar18[2];
          if (uVar24 != 0) {
            do {
              bVar9 = 1 < uVar24;
              uVar24 = uVar24 >> 1;
            } while (bVar9);
          }
        }
        printf(" (points-to size: %zu)\n");
        local_98 = *(undefined1 (*) [8])(pPVar8 + 0xc0);
        local_90.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
        _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
                 (__node_type *)0x0;
        p_Stack_88 = (_Link_type)0x0;
        if (*(long *)(pPVar8 + 200) != 0) {
          uVar24 = *(ulong *)((long)&(((__node_type *)local_98)->
                                     super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                     ).
                                     super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                                     ._M_storage._M_storage + 8);
          p_Stack_88 = (_Link_type)0x0;
          uVar10 = uVar24 & 1;
          while (uVar10 == 0) {
            if (p_Stack_88 == (_Link_type)0x3f) {
              p_Stack_88 = (_Link_type)0x40;
              break;
            }
            bVar20 = (byte)p_Stack_88;
            p_Stack_88 = (_Link_type)((long)&(p_Stack_88->super__Rb_tree_node_base)._M_color + 1);
            uVar10 = uVar24 >> (bVar20 & 0x3f) & 2;
          }
        }
        if ((p_Stack_88 != (_Link_type)0x0) || (local_98 != (undefined1  [8])0x0)) {
          do {
            lVar21 = (long)p_Stack_88 * 0x10 + __M_assign;
            lVar19 = (long)*(_Link_type *)
                            &(((_Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                *)((long)local_98 + 8))->
                             super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                             )._M_storage._M_storage * 0x10;
            node_00 = *(PSNode **)(lVar19 + -0x10 + lVar21);
            lVar19 = *(long *)(lVar19 + -8 + lVar21);
            printf("    -> ");
            printName(node_00,false);
            if (lVar19 == lVar15) {
              puts(" + Offset::UNKNOWN");
            }
            else {
              printf(" + %lu\n");
            }
            dg::ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
            ::const_iterator::operator++((const_iterator *)local_98);
          } while (local_98 != (undefined1  [8])0x0 || p_Stack_88 != (_Link_type)0x0);
        }
        if (verbose[0x80] != '\0') {
          dumpPointerGraphData(pPVar8,type,false);
        }
      }
      puVar27 = puVar27 + 1;
      if (puVar27 == puVar7) {
        return;
      }
    } while( true );
  }
  puts("digraph \"Pointer State Subgraph\" {");
  local_68 = pta;
  if (callgraph[0x80] == '\x01') {
    pPVar3 = pta->PS;
    p_Var16 = (pPVar3->callGraph)._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(pPVar3->callGraph)._mapping._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var16 != p_Var1) {
      do {
        uVar2 = *(uint *)&p_Var16[1]._M_parent;
        auVar28 = llvm::Value::getName();
        lVar15 = auVar28._0_8_;
        local_98 = (undefined1  [8])&p_Stack_88;
        if (lVar15 == 0) {
          local_90.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
          _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
                   (__node_type *)0x0;
          p_Stack_88 = (_Link_type)((ulong)p_Stack_88 & 0xffffffffffffff00);
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,lVar15,auVar28._8_8_ + lVar15);
        }
        printf("NODEcg%u [label=\"%s\"]\n",(ulong)uVar2,local_98);
        if (local_98 != (undefined1  [8])&p_Stack_88) {
          operator_delete((void *)local_98,
                          (ulong)((long)&(p_Stack_88->super__Rb_tree_node_base)._M_color + 1));
        }
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
      } while ((_Rb_tree_header *)p_Var16 != p_Var1);
      p_Var16 = (pPVar3->callGraph)._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    for (; (_Rb_tree_header *)p_Var16 != p_Var1;
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
      p_Var4 = p_Var16[1]._M_right;
      for (p_Var25 = p_Var16[1]._M_left; p_Var25 != p_Var4; p_Var25 = (_Base_ptr)&p_Var25->_M_parent
          ) {
        printf("NODEcg%u -> NODEcg%u\n",(ulong)*(uint *)&p_Var16[1]._M_parent,
               (ulong)**(uint **)p_Var25);
      }
    }
    if (callgraph_only[0x80] != '\0') goto LAB_001127ed;
  }
  pDVar13 = local_68;
  local_40 = display_only_func.
             super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (display_only_func.
      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      display_only_func.
      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pPVar3 = local_68->PS;
    ppPVar26 = (pPVar3->_globals).
               super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppPVar6 = (pPVar3->_globals).
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppPVar26 != ppPVar6) {
      do {
        if (*ppPVar26 != (PSNode *)0x0) {
          dumpNodeToDot(*ppPVar26,type);
        }
        ppPVar26 = ppPVar26 + 1;
      } while (ppPVar26 != ppPVar6);
      ppPVar6 = (pPVar3->_globals).
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppPVar26 = (pPVar3->_globals).
                      super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppPVar26 != ppPVar6;
          ppPVar26 = ppPVar26 + 1) {
        if (*ppPVar26 != (PSNode *)0x0) {
          dumpNodeEdgesToDot(*ppPVar26);
        }
      }
    }
    pPVar3 = pDVar13->PS;
    puVar27 = (pPVar3->nodes).
              super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (pPVar3->nodes).
             super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar27 != puVar7) {
      do {
        pPVar8 = (puVar27->_M_t).
                 super___uniq_ptr_impl<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>._M_t.
                 super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>.
                 super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl;
        if (pPVar8 != (PSNode *)0x0) {
          dumpNodeToDot(pPVar8,type);
        }
        puVar27 = puVar27 + 1;
      } while (puVar27 != puVar7);
      puVar7 = (pPVar3->nodes).
               super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar27 = (pPVar3->nodes).
                     super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar27 != puVar7;
          puVar27 = puVar27 + 1) {
        pPVar8 = (puVar27->_M_t).
                 super___uniq_ptr_impl<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>._M_t.
                 super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>.
                 super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl;
        if (pPVar8 != (PSNode *)0x0) {
          dumpNodeEdgesToDot(pPVar8);
        }
      }
    }
  }
  else {
    local_80 = (_Rb_tree_node_base *)&local_90;
    local_90.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
         = (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
           ((ulong)local_90.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                   _M_cur & 0xffffffff00000000);
    p_Stack_88 = (_Link_type)0x0;
    local_70 = 0;
    ppFVar22 = display_only_func.
               super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_78 = local_80;
    do {
      dg::pta::LLVMPointerGraphBuilder::getFunctionNodes((Function *)&local_58);
      plVar12 = local_50;
      plVar11 = local_58;
      this = (raw_ostream *)llvm::errs();
      pcVar23 = *(char **)(this + 0x20);
      if (plVar11 == plVar12) {
        if ((ulong)(*(long *)(this + 0x18) - (long)pcVar23) < 0x2b) {
          pcVar23 = "ERROR: Did not find any nodes for function ";
          goto LAB_00112629;
        }
        builtin_strncpy(pcVar23,"ERROR: Did not find any nodes for function ",0x2b);
        *(long *)(this + 0x20) = *(long *)(this + 0x20) + 0x2b;
      }
      else {
        if ((ulong)(*(long *)(this + 0x18) - (long)pcVar23) < 6) {
          this = (raw_ostream *)llvm::raw_ostream::write((char *)this,0x11cb21);
        }
        else {
          builtin_strncpy(pcVar23,"Found ",6);
          *(long *)(this + 0x20) = *(long *)(this + 0x20) + 6;
        }
        this = (raw_ostream *)
               llvm::raw_ostream::operator<<(this,(long)local_50 - (long)local_58 >> 3);
        if ((ulong)(*(long *)(this + 0x18) - (long)*(char **)(this + 0x20)) < 0x14) {
          pcVar23 = " nodes for function ";
LAB_00112629:
          this = (raw_ostream *)llvm::raw_ostream::write((char *)this,(ulong)pcVar23);
        }
        else {
          builtin_strncpy(*(char **)(this + 0x20)," nodes for function ",0x14);
          *(long *)(this + 0x20) = *(long *)(this + 0x20) + 0x14;
        }
      }
      pcVar23 = (char *)llvm::raw_ostream::write((char *)this,display_only_abi_cxx11_._128_8_);
      if (*(undefined1 **)(pcVar23 + 0x18) == *(undefined1 **)(pcVar23 + 0x20)) {
        llvm::raw_ostream::write(pcVar23,0x11ce01);
        plVar11 = local_58;
        plVar12 = local_50;
      }
      else {
        **(undefined1 **)(pcVar23 + 0x20) = 10;
        *(long *)(pcVar23 + 0x20) = *(long *)(pcVar23 + 0x20) + 1;
        plVar11 = local_58;
        plVar12 = local_50;
      }
      for (; plVar14 = local_50, plVar11 != local_50; plVar11 = plVar11 + 1) {
        local_60 = (PSNode *)*plVar11;
        local_50 = plVar12;
        std::
        _Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
        ::_M_insert_unique<dg::pta::PSNode*const&>
                  ((_Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
                    *)local_98,&local_60);
        puVar5 = *(undefined8 **)(local_60 + 0x60);
        for (puVar18 = *(undefined8 **)(local_60 + 0x58); puVar18 != puVar5; puVar18 = puVar18 + 1)
        {
          local_38 = (PSNode *)*puVar18;
          std::
          _Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
          ::_M_insert_unique<dg::pta::PSNode*const&>
                    ((_Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
                      *)local_98,&local_38);
        }
        plVar12 = local_50;
        local_50 = plVar14;
      }
      local_50 = plVar12;
      if (local_58 != (long *)0x0) {
        operator_delete(local_58,local_48 - (long)local_58);
      }
      ppFVar22 = ppFVar22 + 1;
    } while (ppFVar22 != local_40);
    for (p_Var16 = local_80; p_Var17 = local_80, p_Var16 != (_Rb_tree_node_base *)&local_90;
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
      if (*(PSNode **)(p_Var16 + 1) != (PSNode *)0x0) {
        dumpNodeToDot(*(PSNode **)(p_Var16 + 1),type);
      }
    }
    for (; p_Var16 = local_80, p_Var17 != (_Rb_tree_node_base *)&local_90;
        p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17)) {
      if (*(PSNode **)(p_Var17 + 1) != (PSNode *)0x0) {
        dumpNodeEdgesToDot(*(PSNode **)(p_Var17 + 1));
      }
    }
    for (; p_Var16 != (_Rb_tree_node_base *)&local_90;
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
      lVar15 = *(long *)(p_Var16 + 1);
      if (((*(uint *)(lVar15 + 0x90) & 0xfffffffe) == 8) && (*(long *)(lVar15 + 0x98) != 0)) {
        printf("\tNODE%u -> NODE%u [penwidth=2 style=dashed]\n",(ulong)*(uint *)(lVar15 + 8),
               (ulong)*(uint *)(*(long *)(lVar15 + 0x98) + 8));
      }
    }
    std::
    _Rb_tree<dg::pta::PSNode_*,_dg::pta::PSNode_*,_std::_Identity<dg::pta::PSNode_*>,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
    ::_M_erase((_Rb_tree<dg::pta::PSNode_*,_dg::pta::PSNode_*,_std::_Identity<dg::pta::PSNode_*>,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
                *)local_98,p_Stack_88);
  }
LAB_001127ed:
  puts("}");
  return;
}

Assistant:

static void dumpPointerGraph(DGLLVMPointerAnalysis *pta, PTType type) {
    assert(pta);

    if (todot)
        dumpPointerGraphdot(pta, type);
    else {
        const auto &nodes = pta->getNodes();
        for (const auto &node : nodes) {
            if (node) // node id 0 is nullptr
                dumpPSNode(node.get(), type);
        }
    }
}